

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O0

jsgf_t * jsgf_parse_string(char *string,jsgf_t *parent)

{
  int iVar1;
  YY_BUFFER_STATE b;
  jsgf_t *jsgf_00;
  YY_BUFFER_STATE buf;
  int yyrv;
  jsgf_t *jsgf;
  yyscan_t yyscanner;
  jsgf_t *parent_local;
  char *string_local;
  
  yyscanner = parent;
  parent_local = (jsgf_t *)string;
  yylex_init(&jsgf);
  b = yy_scan_string((char *)parent_local,jsgf);
  jsgf_00 = jsgf_grammar_new((jsgf_t *)yyscanner);
  if (yyscanner == (yyscan_t)0x0) {
    jsgf_set_search_path(jsgf_00,(char *)0x0);
  }
  iVar1 = yyparse(jsgf,jsgf_00);
  if (iVar1 == 0) {
    yy_delete_buffer(b,jsgf);
    yylex_destroy(jsgf);
    string_local = (char *)jsgf_00;
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
            ,0x37d,"Failed to parse JSGF grammar from input string\n");
    jsgf_grammar_free(jsgf_00);
    yy_delete_buffer(b,jsgf);
    yylex_destroy(jsgf);
    string_local = (char *)0x0;
  }
  return (jsgf_t *)string_local;
}

Assistant:

jsgf_t *
jsgf_parse_string(const char *string, jsgf_t * parent)
{
    yyscan_t yyscanner;
    jsgf_t *jsgf;
    int yyrv;
    YY_BUFFER_STATE buf;

    yylex_init(&yyscanner);
    buf = yy_scan_string(string, yyscanner);

    jsgf = jsgf_grammar_new(parent);
    if (!parent)
        jsgf_set_search_path(jsgf, NULL);

    yyrv = yyparse(yyscanner, jsgf);
    if (yyrv != 0) {
        E_ERROR("Failed to parse JSGF grammar from input string\n");
        jsgf_grammar_free(jsgf);
        yy_delete_buffer(buf, yyscanner);
        yylex_destroy(yyscanner);
        return NULL;
    }
    yy_delete_buffer(buf, yyscanner);
    yylex_destroy(yyscanner);

    return jsgf;
}